

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,RegList l)

{
  StrWriter *pSVar1;
  Rn local_78;
  Rn local_74;
  Rn local_70;
  int local_6c;
  byte local_65;
  int i_3;
  int iStack_60;
  bool first;
  int i_2;
  int i_1;
  int i;
  int r [16];
  StrWriter *this_local;
  RegList l_local;
  
  r._56_8_ = this;
  for (i_2 = 0; i_2 < 0x10; i_2 = i_2 + 1) {
    (&i_1)[i_2] = (uint)(((uint)l.raw & 1 << ((byte)i_2 & 0x1f)) != 0);
  }
  for (iStack_60 = 1; iStack_60 < 0x10; iStack_60 = iStack_60 + 1) {
    if ((&i_1)[iStack_60] != 0) {
      (&i_1)[iStack_60] = (&i_1)[iStack_60 + -1] + 1;
    }
  }
  for (i_3 = 0xe; -1 < i_3; i_3 = i_3 + -1) {
    if (((&i_1)[i_3] != 0) && ((&i_1)[i_3 + 1] != 0)) {
      (&i_1)[i_3] = (&i_1)[i_3 + 1];
    }
  }
  local_65 = 1;
  for (local_6c = 0; local_6c < 0x10; local_6c = (&i_1)[local_6c] + 1 + local_6c) {
    if ((&i_1)[local_6c] != 0) {
      if ((local_65 & 1) == 0) {
        operator<<(this,"/");
      }
      else {
        local_65 = 0;
      }
      if ((&i_1)[local_6c] == 1) {
        Rn::Rn(&local_70,local_6c);
        operator<<(this,local_70);
      }
      else {
        Rn::Rn(&local_74,local_6c);
        pSVar1 = operator<<(this,local_74);
        pSVar1 = operator<<(pSVar1,"-");
        Rn::Rn(&local_78,local_6c + (&i_1)[local_6c] + -1);
        operator<<(pSVar1,local_78);
      }
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(RegList l)
{
    int r[16];

    // Step 1: Fill array r with the register list bits, e.g., 11101101
    for (int i = 0; i <= 15; i++) { r[i] = !!(l.raw & (1 << i)); }

    // Step 2: Convert 11101101 to 12301201
    for (int i = 1; i <= 15; i++) { if (r[i]) r[i] = r[i-1] + 1; }

    // Step 3: Convert 12301201 to 33302201
    for (int i = 14; i >= 0; i--) { if (r[i] && r[i+1]) r[i] = r[i+1]; }

    // Step 4: Convert 33302201 to "D0-D2/D4/D5/D7"
    bool first = true;
    for (int i = 0; i <= 15; i += r[i] + 1) {

        if (r[i] == 0) continue;

        // Print delimiter
        if (first) { first = false; } else { *this << "/"; }

        // Format variant 1: Single register
        if (r[i] == 1) { *this << Rn{i}; }

        // Format variant 2: Register range
        else { *this << Rn{i} << "-" << Rn{i+r[i]-1}; }
    }

    return *this;
}